

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiledata-window.cc
# Opt level: O2

void __thiscall Debugger::TiledataWindow::CalculateAutoObjPaletteIndex(TiledataWindow *this)

{
  Debugger *pDVar1;
  ObjSize OVar2;
  Bool BVar3;
  uint uVar4;
  u8 uVar5;
  int obj_index;
  int index;
  Obj obj;
  Obj local_34;
  
  OVar2 = emulator_get_obj_size(((this->super_Window).d)->e);
  for (index = 0; index != 0x28; index = index + 1) {
    emulator_get_obj(&local_34,((this->super_Window).d)->e,index);
    BVar3 = obj_is_visible(&local_34);
    if (BVar3 != FALSE) {
      uVar4 = (uint)local_34.tile;
      pDVar1 = (this->super_Window).d;
      if (pDVar1->is_cgb == true) {
        uVar4 = local_34.tile + 0x180;
        if (local_34.bank == '\0') {
          uVar4 = (uint)local_34.tile;
        }
        uVar5 = local_34.cgb_palette + '\t';
      }
      else if (pDVar1->is_sgb == true) {
        uVar5 = local_34.palette + '\x05';
      }
      else {
        uVar5 = local_34.palette + '\x02';
      }
      if (OVar2 == OBJ_SIZE_8X16) {
        this->tile_palette_index[uVar4 & 0xfffffffe] = uVar5;
        uVar4 = uVar4 | 1;
      }
      this->tile_palette_index[uVar4] = uVar5;
    }
  }
  return;
}

Assistant:

void Debugger::TiledataWindow::CalculateAutoObjPaletteIndex() {
  ObjSize obj_size = emulator_get_obj_size(d->e);
  for (int obj_index = 0; obj_index < 40; ++obj_index) {
    Obj obj = emulator_get_obj(d->e, obj_index);
    bool visible = static_cast<bool>(obj_is_visible(&obj));
    if (visible) {
      int tile_index = obj.tile;
      int pal_index = 0;
      if (d->is_cgb) {
        if (obj.bank) {
          tile_index += 0x180;
        }
        pal_index = 9 + obj.cgb_palette;
      } else if (d->is_sgb) {
        pal_index = 5 + obj.palette;
      } else {
        pal_index = 2 + obj.palette;
      }

      if (obj_size == OBJ_SIZE_8X16) {
        tile_palette_index[tile_index & ~1] = pal_index;
        tile_palette_index[tile_index | 1] = pal_index;
      } else {
        tile_palette_index[tile_index] = pal_index;
      }
    }
  }
}